

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O1

void intgemm::anon_unknown_0::TestMultiplyShiftInt<intgemm::AVX512VNNI::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  ulong size;
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  size_t __i;
  ostream *poVar1;
  long lVar2;
  float *pfVar3;
  uchar *puVar4;
  ulong uVar5;
  char *pcVar6;
  float *pfVar7;
  char *pcVar8;
  int iVar9;
  float *pfVar10;
  ulong uVar11;
  ulong size_00;
  long lVar12;
  ulong uVar13;
  float fVar14;
  AlignedVector<float> B;
  AlignedVector<float> A;
  AlignedVector<float> bias;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> A_prep2;
  AlignedVector<signed_char> B_quant;
  AlignedVector<signed_char> B_prep;
  AlignedVector<unsigned_char> A_prep;
  AlignedVector<float> ShiftedBias;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> A_prep_old;
  ostringstream info;
  mt19937 gen;
  AlignedVector<float> local_1658;
  AlignedVector<float> local_1648;
  AlignedVector<float> local_1638;
  AlignedVector<float> local_1628;
  float local_1618;
  float local_1614;
  float *local_1610;
  ulong local_1608;
  AlignedVector<signed_char> local_1600;
  AlignedVector<signed_char> local_15f0;
  AlignedVector<signed_char> local_15e0;
  AlignedVector<unsigned_char> local_15d0;
  AlignedVector<float> local_15c0;
  AlignedVector<float> local_15b0;
  AlignedVector<float> local_15a0;
  AlignedVector<signed_char> local_1590;
  undefined4 local_1580;
  undefined4 uStack_157c;
  float *pfStack_1578;
  float *local_1570;
  undefined4 local_1568;
  undefined4 uStack_1564;
  float *pfStack_1560;
  float *local_1558;
  string local_1550;
  ostringstream local_1530 [112];
  ios_base local_14c0 [264];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  size = (ulong)width;
  local_1618 = int_tolerance;
  local_1614 = float_tolerance;
  std::__cxx11::ostringstream::ostringstream(local_1530);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"8-bit AVX512VNNI",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"\t",1);
  local_1608 = (ulong)A_rows;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1530);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_13b8,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_13b8,1);
  size_00 = (ulong)B_cols;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_13b8._M_x[0] = CONCAT71(local_13b8._M_x[0]._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_13b8,1);
  AlignedVector<float>::AlignedVector(&local_1648,(ulong)(width * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&local_1658,(ulong)(B_cols * width),0x40);
  AlignedVector<float>::AlignedVector(&local_1638,size_00,0x40);
  pfVar3 = local_1648.mem_;
  local_13b8._M_x[0] = 0x1571;
  lVar2 = 1;
  uVar5 = 0x1571;
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar2);
    local_13b8._M_x[lVar2] = uVar5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13b8._M_p = 0x270;
  if (local_1648.size_ != 0) {
    lVar12 = local_1648.size_ << 2;
    lVar2 = 0;
    do {
      fVar14 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar3 + lVar2) = fVar14 + fVar14 + -1.0;
      lVar2 = lVar2 + 4;
    } while (lVar12 != lVar2);
  }
  pfVar3 = local_1658.mem_;
  lVar2 = CONCAT44(local_1658.size_._4_4_,(Index)local_1658.size_);
  if (lVar2 != 0) {
    lVar12 = 0;
    do {
      fVar14 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar3 + lVar12) = fVar14 + fVar14 + -1.0;
      lVar12 = lVar12 + 4;
    } while (lVar2 << 2 != lVar12);
  }
  if (local_1638.size_ != 0) {
    memset(local_1638.mem_,0,local_1638.size_ << 2);
  }
  AlignedVector<unsigned_char>::AlignedVector(&local_15d0,local_1648.size_,0x40);
  AlignedVector<signed_char>::AlignedVector(&local_1590,local_1648.size_,0x40);
  AlignedVector<signed_char>::AlignedVector
            (&local_15e0,CONCAT44(local_1658.size_._4_4_,(Index)local_1658.size_),0x40);
  AVX512BW::Kernels8::PrepareA(local_1648.mem_,local_15d0.mem_,63.5,A_rows,width);
  AVX512BW::Kernels8::PrepareA(local_1648.mem_,local_1590.mem_,63.5,A_rows,width);
  AVX512BW::Kernels8::PrepareB(local_1658.mem_,local_15e0.mem_,63.5,width,B_cols);
  AlignedVector<float>::AlignedVector(&local_1628,(ulong)(B_cols * A_rows),0x40);
  AlignedVector<signed_char>::AlignedVector
            (&local_15f0,CONCAT44(local_1658.size_._4_4_,(Index)local_1658.size_),0x40);
  AVX512BW::Kernels8::Quantize(local_1658.mem_,local_15f0.mem_,63.5,(Index)local_1658.size_);
  AlignedVector<float>::AlignedVector(&local_15a0,local_1628.size_,0x40);
  AlignedVector<float>::AlignedVector(&local_15b0,local_1628.size_,0x40);
  if (A_rows != 0) {
    uVar5 = 0;
    pfVar3 = local_1648.mem_;
    do {
      if (B_cols != 0) {
        uVar11 = 0;
        pfVar10 = local_1658.mem_;
        do {
          if (width == 0) {
            fVar14 = 0.0;
          }
          else {
            fVar14 = 0.0;
            uVar13 = 0;
            pfVar7 = pfVar10;
            do {
              fVar14 = fVar14 + *pfVar7 * pfVar3[uVar13];
              uVar13 = uVar13 + 1;
              pfVar7 = pfVar7 + size_00;
            } while (size != uVar13);
          }
          local_15b0.mem_[uVar5 * size_00 + uVar11] = fVar14 + local_1638.mem_[uVar11];
          uVar11 = uVar11 + 1;
          pfVar10 = pfVar10 + 1;
        } while (uVar11 != size_00);
      }
      uVar5 = uVar5 + 1;
      pfVar3 = pfVar3 + size;
    } while (uVar5 != local_1608);
  }
  AlignedVector<signed_char>::AlignedVector(&local_1600,size,0x40);
  if (local_1600.size_ != 0) {
    memset(local_1600.mem_,1,local_1600.size_);
  }
  AlignedVector<float>::AlignedVector(&local_15c0,size_00,0x40);
  if (B_cols != 0) {
    uVar5 = 0;
    pcVar6 = local_15f0.mem_;
    do {
      if (width == 0) {
        fVar14 = 0.0;
      }
      else {
        uVar11 = 0;
        iVar9 = 0;
        pcVar8 = pcVar6;
        do {
          iVar9 = iVar9 + (int)*pcVar8 * (int)local_1600.mem_[uVar11];
          uVar11 = uVar11 + 1;
          pcVar8 = pcVar8 + size_00;
        } while (size != uVar11);
        fVar14 = (float)iVar9;
      }
      local_15c0.mem_[uVar5] = fVar14 * -0.031496063 + local_1638.mem_[uVar5];
      uVar5 = uVar5 + 1;
      pcVar6 = pcVar6 + 1;
    } while (uVar5 != size_00);
  }
  local_1568 = 0xbd010204;
  pfStack_1560 = local_1638.mem_;
  local_1558 = local_1638.mem_;
  callback._4_4_ = uStack_1564;
  callback.unquant_mult = -0.031496063;
  callback.bias_addr = local_1638.mem_;
  callback.output_addr = local_1638.mem_;
  AVX512VNNI::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (local_15e0.mem_,width,B_cols,callback);
  local_1580 = 0x39820610;
  pfStack_1578 = local_1638.mem_;
  local_1570 = local_1628.mem_;
  callback_00._4_4_ = uStack_157c;
  callback_00.unquant_mult = 0.0002480005;
  callback_00.bias_addr = local_1638.mem_;
  callback_00.output_addr = local_1628.mem_;
  AVX512VNNI::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (local_15d0.mem_,local_15e0.mem_,A_rows,width,B_cols,callback_00);
  pfVar10 = local_15b0.mem_;
  pfVar3 = local_1628.mem_;
  local_1610 = local_15a0.mem_;
  if (A_rows != 0) {
    uVar5 = 0;
    puVar4 = local_15d0.mem_;
    do {
      if (B_cols != 0) {
        uVar11 = 0;
        pcVar6 = local_15f0.mem_;
        do {
          if (width == 0) {
            fVar14 = 0.0;
          }
          else {
            uVar13 = 0;
            iVar9 = 0;
            pcVar8 = pcVar6;
            do {
              iVar9 = iVar9 + (int)*pcVar8 * (uint)puVar4[uVar13];
              uVar13 = uVar13 + 1;
              pcVar8 = pcVar8 + size_00;
            } while (size != uVar13);
            fVar14 = (float)iVar9;
          }
          local_15a0.mem_[uVar5 * size_00 + uVar11] =
               fVar14 * 0.0002480005 + local_15c0.mem_[uVar11];
          uVar11 = uVar11 + 1;
          pcVar6 = pcVar6 + 1;
        } while (uVar11 != size_00);
      }
      uVar5 = uVar5 + 1;
      puVar4 = puVar4 + size;
    } while (uVar5 != local_1608);
  }
  std::__cxx11::stringbuf::str();
  CompareMSE(pfVar10,local_1610,pfVar3,local_1628.size_,&local_1550,0.0001,local_1618,local_1614,
             0.0001);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
    operator_delete(local_1550._M_dataplus._M_p);
  }
  free(local_15c0.mem_);
  free(local_1600.mem_);
  free(local_15b0.mem_);
  free(local_15a0.mem_);
  free(local_15f0.mem_);
  free(local_1628.mem_);
  free(local_15e0.mem_);
  free(local_1590.mem_);
  free(local_15d0.mem_);
  free(local_1638.mem_);
  free(local_1658.mem_);
  free(local_1648.mem_);
  std::__cxx11::ostringstream::~ostringstream(local_1530);
  std::ios_base::~ios_base(local_14c0);
  return;
}

Assistant:

void TestMultiplyShiftInt(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = 0;
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> A_prep_old(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareA(A.begin(), A_prep_old.begin(), quant_mult, A_rows, width); //Non shited version
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*
   * Reference float multiplication
   */
  AlignedVector<int8_t> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Taking the original A_preparation which means A would be int8_t
  // references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
  //   return sum * unquant_mult + bias[info.col_idx];
  // });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });
  /*
   * Multiply8 shift multiplication
   */
  //First prepare SlowInteger Bias:
  AlignedVector<int8_t> A_prep2(1*width);
  for (auto& it : A_prep2) {
    it = 1;
  }
  AlignedVector<float> ShiftedBias(B_cols);
  float unquant_mult_forprep = (-1)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  references::Multiply(A_prep2.begin(), B_quant.begin(), ShiftedBias.begin(), 1, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult_forprep + bias[info.col_idx];
  });
  

  //Now prepare Fast integer Bias
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  // Reference INT VERSION HERE with ADD127
  // Taking the original A_preparation which means A would be int8_t
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult + ShiftedBias[info.col_idx];
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}